

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resizable_split.cpp
# Opt level: O3

Component __thiscall
ftxui::ResizableSplitBottom(ftxui *this,Component *main,Component *back,int *main_size)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined8 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  pointer *__ptr;
  long lVar3;
  bool bVar4;
  Component CVar5;
  initializer_list<std::shared_ptr<ftxui::ComponentBase>_> __l;
  allocator_type local_81;
  element_type *peStack_80;
  shared_ptr<ftxui::ComponentBase> local_78;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  Component local_58;
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  local_48;
  
  puVar1 = (undefined8 *)operator_new(0x88);
  local_68 = (main->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (main->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
            ._M_pi;
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_001748b0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_78.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (back->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_01 = (back->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
            ._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  puVar1[5] = 0;
  puVar1[6] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[2] = &PTR__ResizableSplitBottomBase_00174900;
  puVar1[7] = local_68;
  puVar1[8] = this_00;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  puVar1[9] = local_78.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  puVar1[10] = this_01;
  if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    puVar1[0xb] = main_size;
    puVar1[0xc] = 0;
    puVar1[0xd] = 0;
    puVar1[0xe] = 0;
    puVar1[0xf] = 0;
    puVar1[0x10] = 0;
    local_78.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_78.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = this_01;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
      bVar4 = __libc_single_threaded == '\0';
      puVar1[0xb] = main_size;
      puVar1[0xe] = 0;
      puVar1[0xf] = 0;
      puVar1[0xc] = 0;
      puVar1[0xd] = 0;
      puVar1[0x10] = 0;
      if (bVar4) {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
        goto LAB_001420ff;
      }
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
      puVar1[0xb] = main_size;
      puVar1[0xe] = 0;
      puVar1[0xf] = 0;
      puVar1[0xc] = 0;
      puVar1[0xd] = 0;
      puVar1[0x10] = 0;
    }
    this_01->_M_use_count = this_01->_M_use_count + 1;
  }
LAB_001420ff:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  __l._M_len = 2;
  __l._M_array = &local_78;
  local_60 = this_00;
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::vector(&local_48,__l,&local_81);
  Container::Vertical((Container *)&local_58,&local_48);
  ComponentBase::Add((ComponentBase *)(puVar1 + 2),&local_58);
  if (local_58.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector(&local_48);
  lVar3 = 0x20;
  _Var2._M_pi = extraout_RDX;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&peStack_80 + lVar3) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&peStack_80 + lVar3));
      _Var2._M_pi = extraout_RDX_00;
    }
    lVar3 = lVar3 + -0x10;
  } while (lVar3 != 0);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    _Var2._M_pi = extraout_RDX_01;
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var2._M_pi = extraout_RDX_02;
  }
  *(ComponentBase **)this = (ComponentBase *)(puVar1 + 2);
  *(undefined8 **)(this + 8) = puVar1;
  CVar5.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  CVar5.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Component)CVar5.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component ResizableSplitBottom(Component main, Component back, int* main_size) {
  return Make<ResizableSplitBottomBase>(std::move(main), std::move(back),
                                        main_size);
}